

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandSeqCleanup(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint fVeryVerbose;
  uint nFramesSymb;
  uint fVerbose;
  Abc_Ntk_t *pAVar2;
  undefined4 extraout_var;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  undefined8 local_48;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  local_5c = 0;
  Extra_UtilGetoptReset();
  local_48 = 0x200;
  local_68 = 1;
  local_64 = 1;
  local_60 = 1;
  nFramesSymb = 1;
  fVerbose = 0;
  fVeryVerbose = 0;
  do {
    while( true ) {
      while( true ) {
        while (iVar1 = Extra_UtilGetopt(argc,argv,"cenmFSvwh"), iVar4 = globalUtilOptind,
              0x6c < iVar1) {
          if (iVar1 < 0x76) {
            if (iVar1 == 0x6d) {
              local_5c = local_5c ^ 1;
            }
            else {
              if (iVar1 != 0x6e) goto LAB_0021aa0c;
              local_60 = local_60 ^ 1;
            }
          }
          else if (iVar1 == 0x76) {
            fVerbose = fVerbose ^ 1;
          }
          else {
            if (iVar1 != 0x77) goto LAB_0021aa0c;
            fVeryVerbose = fVeryVerbose ^ 1;
          }
        }
        if (iVar1 < 99) break;
        if (iVar1 == 99) {
          local_68 = local_68 ^ 1;
        }
        else {
          if (iVar1 != 0x65) goto LAB_0021aa0c;
          local_64 = local_64 ^ 1;
        }
      }
      if (iVar1 == 0x46) break;
      if (iVar1 != 0x53) {
        if (iVar1 == -1) {
          if (pAVar2 == (Abc_Ntk_t *)0x0) {
            pcVar3 = "Empty network.\n";
          }
          else if (pAVar2->ntkType == ABC_NTK_STRASH) {
            if (pAVar2->nObjCounts[8] == 0) {
              Abc_Print(-1,"The network is combinational.\n");
              return 0;
            }
            pAVar2 = Abc_NtkDarLatchSweep
                               (pAVar2,local_68,local_64,local_60,local_5c,nFramesSymb,(int)local_48
                                ,fVerbose,fVeryVerbose);
            if (pAVar2 != (Abc_Ntk_t *)0x0) {
              Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
              return 0;
            }
            pcVar3 = "Sequential cleanup has failed.\n";
          }
          else {
            pcVar3 = "Only works for structrally hashed networks.\n";
          }
          iVar4 = -1;
          goto LAB_0021ab46;
        }
        goto LAB_0021aa0c;
      }
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-S\" should be followed by an integer.\n";
LAB_0021aa00:
        Abc_Print(-1,pcVar3);
        goto LAB_0021aa0c;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      local_48 = CONCAT44(extraout_var,iVar1);
      globalUtilOptind = iVar4 + 1;
      if (iVar1 < 0) goto LAB_0021aa0c;
    }
    if (argc <= globalUtilOptind) {
      pcVar3 = "Command line switch \"-F\" should be followed by an integer.\n";
      goto LAB_0021aa00;
    }
    nFramesSymb = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar4 + 1;
  } while (-1 < (int)nFramesSymb);
LAB_0021aa0c:
  Abc_Print(-2,"usage: scleanup [-cenmFSvwh]\n");
  Abc_Print(-2,"\t         performs sequential cleanup of the current network\n");
  Abc_Print(-2,"\t         by removing nodes and latches that do not feed into POs\n");
  pcVar5 = "yes";
  pcVar3 = "yes";
  if (local_68 == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-c     : sweep stuck-at latches detected by ternary simulation [default = %s]\n",
            pcVar3);
  pcVar3 = "yes";
  if (local_64 == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-e     : merge equal latches (same data inputs and init states) [default = %s]\n",
            pcVar3);
  pcVar3 = "yes";
  if (local_60 == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-n     : toggle preserving latch names [default = %s]\n",pcVar3);
  pcVar3 = "yes";
  if (local_5c == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-m     : toggle using hybrid ternary/symbolic simulation [default = %s]\n",pcVar3)
  ;
  Abc_Print(-2,"\t-F num : the number of first frames simulated symbolically [default = %d]\n",
            (ulong)nFramesSymb);
  Abc_Print(-2,"\t-S num : the number of frames when symbolic saturation begins [default = %d]\n",
            local_48);
  pcVar3 = "yes";
  if (fVerbose == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar3);
  if (fVeryVerbose == 0) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-w     : toggle very verbose output [default = %s]\n",pcVar5);
  pcVar3 = "\t-h     : print the command usage\n";
  iVar4 = -2;
LAB_0021ab46:
  Abc_Print(iVar4,pcVar3);
  return 1;
}

Assistant:

int Abc_CommandSeqCleanup( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c;
    int fLatchConst  =   1;
    int fLatchEqual  =   1;
    int fSaveNames   =   1;
    int fUseMvSweep  =   0;
    int nFramesSymb  =   1;
    int nFramesSatur = 512;
    int fVerbose     =   0;
    int fVeryVerbose =   0;
    pNtk = Abc_FrameReadNtk(pAbc);

    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "cenmFSvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'c':
            fLatchConst ^= 1;
            break;
        case 'e':
            fLatchEqual ^= 1;
            break;
        case 'n':
            fSaveNames ^= 1;
            break;
        case 'm':
            fUseMvSweep ^= 1;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFramesSymb = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFramesSymb < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            nFramesSatur = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFramesSatur < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Only works for structrally hashed networks.\n" );
        return 1;
    }
    if ( !Abc_NtkLatchNum(pNtk) )
    {
        Abc_Print( -1, "The network is combinational.\n" );
        return 0;
    }
    // modify the current network
    pNtkRes = Abc_NtkDarLatchSweep( pNtk, fLatchConst, fLatchEqual, fSaveNames, fUseMvSweep, nFramesSymb, nFramesSatur, fVerbose, fVeryVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Sequential cleanup has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: scleanup [-cenmFSvwh]\n" );
    Abc_Print( -2, "\t         performs sequential cleanup of the current network\n" );
    Abc_Print( -2, "\t         by removing nodes and latches that do not feed into POs\n" );
    Abc_Print( -2, "\t-c     : sweep stuck-at latches detected by ternary simulation [default = %s]\n", fLatchConst? "yes": "no" );
    Abc_Print( -2, "\t-e     : merge equal latches (same data inputs and init states) [default = %s]\n", fLatchEqual? "yes": "no" );
    Abc_Print( -2, "\t-n     : toggle preserving latch names [default = %s]\n", fSaveNames? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle using hybrid ternary/symbolic simulation [default = %s]\n", fUseMvSweep? "yes": "no" );
    Abc_Print( -2, "\t-F num : the number of first frames simulated symbolically [default = %d]\n", nFramesSymb );
    Abc_Print( -2, "\t-S num : the number of frames when symbolic saturation begins [default = %d]\n", nFramesSatur );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle very verbose output [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}